

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixShmLock(sqlite3_file *fd,int ofst,int n,int flags)

{
  ushort *puVar1;
  sqlite3_io_methods *psVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  sqlite3_io_methods *psVar7;
  ushort uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  
  psVar2 = fd[8].pMethods;
  lVar3 = *(long *)psVar2;
  if (*(sqlite3_mutex **)(lVar3 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar3 + 8));
  }
  uVar9 = (1 << ((char)n + (byte)ofst & 0x1f)) + (-1 << ((byte)ofst & 0x1f));
  if ((flags & 1U) == 0) {
    lVar6 = *(long *)(lVar3 + 0x38);
    if ((flags & 4U) == 0) {
      if (lVar6 != 0) {
        iVar4 = 5;
        do {
          if (((uVar9 & *(ushort *)(lVar6 + 0x14)) != 0) ||
             ((uVar9 & *(ushort *)(lVar6 + 0x12)) != 0)) goto LAB_00147011;
          lVar6 = *(long *)(lVar6 + 8);
        } while (lVar6 != 0);
      }
      uVar5 = *(uint *)((fd[2].pMethods)->xLock + 0x18);
      if ((-1 < (int)uVar5) && (iVar4 = (*aSyscall[7].pCurrent)((ulong)uVar5,6), iVar4 == -1)) {
LAB_00147074:
        iVar4 = 5;
        goto LAB_00147011;
      }
      puVar1 = (ushort *)((long)&psVar2->xRead + 4);
      *puVar1 = *puVar1 | (ushort)uVar9;
    }
    else {
      if (lVar6 == 0) {
        uVar5 = 0;
      }
      else {
        uVar8 = 0;
        do {
          if ((uVar9 & *(ushort *)(lVar6 + 0x14)) != 0) goto LAB_00147074;
          uVar8 = uVar8 | *(ushort *)(lVar6 + 0x12);
          lVar6 = *(long *)(lVar6 + 8);
        } while (lVar6 != 0);
        uVar5 = (uint)uVar8;
      }
      if ((((uVar9 & uVar5) == 0) &&
          (uVar5 = *(uint *)((fd[2].pMethods)->xLock + 0x18), -1 < (int)uVar5)) &&
         (iVar4 = (*aSyscall[7].pCurrent)((ulong)uVar5,6), iVar4 == -1)) goto LAB_00147074;
      puVar1 = (ushort *)((long)&psVar2->xRead + 2);
      *puVar1 = *puVar1 | (ushort)uVar9;
    }
  }
  else {
    psVar7 = *(sqlite3_io_methods **)(lVar3 + 0x38);
    if (psVar7 == (sqlite3_io_methods *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar8 = 0;
      do {
        if (psVar7 != psVar2) {
          uVar8 = uVar8 | *(ushort *)((long)&psVar7->xRead + 2);
        }
        psVar7 = (sqlite3_io_methods *)psVar7->xClose;
      } while (psVar7 != (sqlite3_io_methods *)0x0);
      uVar5 = (uint)uVar8;
    }
    if ((((uVar9 & uVar5) == 0) &&
        (uVar5 = *(uint *)((fd[2].pMethods)->xLock + 0x18), -1 < (int)uVar5)) &&
       (iVar4 = (*aSyscall[7].pCurrent)((ulong)uVar5,6), iVar4 == -1)) goto LAB_00147074;
    auVar10 = pshuflw(ZEXT416(~uVar9),ZEXT416(~uVar9),0);
    *(uint *)((long)&psVar2->xRead + 2) = auVar10._0_4_ & *(uint *)((long)&psVar2->xRead + 2);
  }
  iVar4 = 0;
LAB_00147011:
  if (*(sqlite3_mutex **)(lVar3 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar3 + 8));
  }
  return iVar4;
}

Assistant:

static int unixShmLock(
  sqlite3_file *fd,          /* Database file holding the shared memory */
  int ofst,                  /* First lock to acquire or release */
  int n,                     /* Number of locks to acquire or release */
  int flags                  /* What to do with the lock */
){
  unixFile *pDbFd = (unixFile*)fd;      /* Connection holding shared memory */
  unixShm *p = pDbFd->pShm;             /* The shared memory being locked */
  unixShm *pX;                          /* For looping over all siblings */
  unixShmNode *pShmNode = p->pShmNode;  /* The underlying file iNode */
  int rc = SQLITE_OK;                   /* Result code */
  u16 mask;                             /* Mask of locks to take or release */

  assert( pShmNode==pDbFd->pInode->pShmNode );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( ofst>=0 && ofst+n<=SQLITE_SHM_NLOCK );
  assert( n>=1 );
  assert( flags==(SQLITE_SHM_LOCK | SQLITE_SHM_SHARED)
       || flags==(SQLITE_SHM_LOCK | SQLITE_SHM_EXCLUSIVE)
       || flags==(SQLITE_SHM_UNLOCK | SQLITE_SHM_SHARED)
       || flags==(SQLITE_SHM_UNLOCK | SQLITE_SHM_EXCLUSIVE) );
  assert( n==1 || (flags & SQLITE_SHM_EXCLUSIVE)!=0 );
  assert( pShmNode->hShm>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->hShm<0 || pDbFd->pInode->bProcessLock==0 );

  mask = (1<<(ofst+n)) - (1<<ofst);
  assert( n>1 || mask==(1<<ofst) );
  sqlite3_mutex_enter(pShmNode->pShmMutex);
  if( flags & SQLITE_SHM_UNLOCK ){
    u16 allMask = 0; /* Mask of locks held by siblings */

    /* See if any siblings hold this same lock */
    for(pX=pShmNode->pFirst; pX; pX=pX->pNext){
      if( pX==p ) continue;
      assert( (pX->exclMask & (p->exclMask|p->sharedMask))==0 );
      allMask |= pX->sharedMask;
    }

    /* Unlock the system-level locks */
    if( (mask & allMask)==0 ){
      rc = unixShmSystemLock(pDbFd, F_UNLCK, ofst+UNIX_SHM_BASE, n);
    }else{
      rc = SQLITE_OK;
    }

    /* Undo the local locks */
    if( rc==SQLITE_OK ){
      p->exclMask &= ~mask;
      p->sharedMask &= ~mask;
    } 
  }else if( flags & SQLITE_SHM_SHARED ){
    u16 allShared = 0;  /* Union of locks held by connections other than "p" */

    /* Find out which shared locks are already held by sibling connections.
    ** If any sibling already holds an exclusive lock, go ahead and return
    ** SQLITE_BUSY.
    */
    for(pX=pShmNode->pFirst; pX; pX=pX->pNext){
      if( (pX->exclMask & mask)!=0 ){
        rc = SQLITE_BUSY;
        break;
      }
      allShared |= pX->sharedMask;
    }

    /* Get shared locks at the system level, if necessary */
    if( rc==SQLITE_OK ){
      if( (allShared & mask)==0 ){
        rc = unixShmSystemLock(pDbFd, F_RDLCK, ofst+UNIX_SHM_BASE, n);
      }else{
        rc = SQLITE_OK;
      }
    }

    /* Get the local shared locks */
    if( rc==SQLITE_OK ){
      p->sharedMask |= mask;
    }
  }else{
    /* Make sure no sibling connections hold locks that will block this
    ** lock.  If any do, return SQLITE_BUSY right away.
    */
    for(pX=pShmNode->pFirst; pX; pX=pX->pNext){
      if( (pX->exclMask & mask)!=0 || (pX->sharedMask & mask)!=0 ){
        rc = SQLITE_BUSY;
        break;
      }
    }
  
    /* Get the exclusive locks at the system level.  Then if successful
    ** also mark the local connection as being locked.
    */
    if( rc==SQLITE_OK ){
      rc = unixShmSystemLock(pDbFd, F_WRLCK, ofst+UNIX_SHM_BASE, n);
      if( rc==SQLITE_OK ){
        assert( (p->sharedMask & mask)==0 );
        p->exclMask |= mask;
      }
    }
  }
  sqlite3_mutex_leave(pShmNode->pShmMutex);
  OSTRACE(("SHM-LOCK shmid-%d, pid-%d got %03x,%03x\n",
           p->id, osGetpid(0), p->sharedMask, p->exclMask));
  return rc;
}